

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::DrawTest::iterate(DrawTest *this)

{
  Primitive PVar1;
  DrawMethod DVar2;
  IndexType IVar3;
  int iVar4;
  int iVar5;
  AttributePack *pAVar6;
  undefined8 uVar7;
  Storage SVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  MethodInfo MVar16;
  size_type sVar17;
  reference this_00;
  reference a;
  reference b;
  TestLog *pTVar18;
  reference description;
  size_type sVar19;
  size_t sVar20;
  unsigned_long uVar21;
  MessageBuilder *this_01;
  const_reference __src;
  AttributeArray *pAVar22;
  char *pcVar23;
  bool bVar24;
  GenericVec4 GVar25;
  char *local_870;
  unsigned_long local_820;
  unsigned_long local_810;
  long local_808;
  byte local_7c5;
  int local_798;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  bool local_749;
  byte local_739;
  byte local_721;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  CompatibilityTestType local_6a8;
  CompatibilityTestType ctype_1;
  CompatibilityTestType ctype;
  Error *err;
  undefined1 local_4b8 [8];
  UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
  rrArray;
  undefined1 local_4a0 [8];
  UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
  glArray;
  char *indexPointer;
  char *indexPointerBase;
  char *indexArray;
  size_t indexArraySize;
  size_t indexElementSize;
  int seed_2;
  char *data;
  size_t bufferSize;
  size_t referencedElementCount;
  size_t evaluatedElementCount;
  size_t stride;
  size_t elementSize;
  int seed_1;
  GenericVec4 attribValue;
  int seed;
  OutputType OStack_410;
  bool isPositionAttr;
  AttributeSpec attribSpec;
  int attribNdx;
  string local_268;
  MessageBuilder local_248;
  undefined1 local_c8 [8];
  GenericVec4 nullAttribValue;
  float colorScale;
  float coordScale;
  int indexMax;
  int maxElementIndex;
  size_t elementCount;
  int indexBase;
  int baseVertexAddition;
  int firstAddition;
  int indexMin;
  size_t primitiveElementCount;
  bool hasBaseVtx;
  bool hasFirst;
  bool ranged;
  bool instanced;
  bool indexed;
  undefined1 local_68 [2];
  MethodInfo methodInfo;
  IterationLogSectionEmitter sectionEmitter;
  bool updateProgram;
  DrawTestSpec *spec;
  IterateResult iterateResult;
  bool compareStep;
  bool drawStep;
  int specNdx;
  DrawTest *this_local;
  
  iVar12 = this->m_iteration / 2;
  bVar24 = this->m_iteration % 2 == 0;
  iVar13 = this->m_iteration;
  iVar14 = this->m_iteration;
  sVar17 = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::size
                     (&this->m_specs);
  this_local._4_4_ = (IterateResult)((long)iVar14 + 1 != sVar17 * 2);
  this_00 = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::
            operator[](&this->m_specs,(long)iVar12);
  local_721 = 1;
  if (this->m_iteration != 0) {
    local_739 = 0;
    if (bVar24) {
      a = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::operator[]
                    (&this->m_specs,(long)iVar12);
      b = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::operator[]
                    (&this->m_specs,(long)(iVar12 + -1));
      bVar11 = anon_unknown_1::checkSpecsShaderCompatible(a,b);
      local_739 = bVar11 ^ 0xff;
    }
    local_721 = local_739;
  }
  pTVar18 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  sVar17 = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::size
                     (&this->m_specs);
  description = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->m_iteration_descriptions,(long)iVar12);
  local_749 = false;
  if (bVar24) {
    sVar19 = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::size
                       (&this->m_specs);
    local_749 = sVar19 != 1;
  }
  anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
            ((IterationLogSectionEmitter *)local_68,pTVar18,(long)iVar12,sVar17,description,
             local_749);
  if (bVar24) {
    MVar16 = anon_unknown_1::getMethodInfo(this_00->drawMethod);
    sVar20 = anon_unknown_1::getElementCount(this_00->primitive,(long)this_00->primitiveCount);
    if (((uint6)MVar16 & 0x10000) == 0) {
      local_784 = 0;
    }
    else {
      local_784 = this_00->indexMin;
    }
    if (((uint6)MVar16 & 0x1000000) == 0) {
      local_788 = 0;
    }
    else {
      local_788 = this_00->first;
    }
    if ((((uint6)MVar16 & 0x100000000) == 0) || (this_00->baseVertex < 1)) {
      local_78c = 0;
    }
    else {
      local_78c = this_00->baseVertex;
    }
    if ((((uint6)MVar16 & 0x100000000) == 0) || (-1 < this_00->baseVertex)) {
      local_790 = 0;
    }
    else {
      local_790 = -this_00->baseVertex;
    }
    uVar21 = sVar20 + (long)local_784 + (long)local_788 + (long)local_78c;
    iVar13 = (int)sVar20;
    local_798 = iVar13 + local_784 + local_788 + -1;
    if (((uint6)MVar16 & 0x10000) != 0) {
      local_798 = de::clamp<int>(this_00->indexMax,0,local_798);
    }
    iVar14 = de::max<int>(0,local_798);
    nullAttribValue.v.fData[3] = getCoordScale(this,this_00);
    nullAttribValue.v.fData[2] = getColorScale(this,this_00);
    rr::GenericVec4::GenericVec4((GenericVec4 *)local_c8);
    pTVar18 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_248,pTVar18,(BeginMessageToken *)&tcu::TestLog::Message);
    DrawTestSpec::getMultilineDesc_abi_cxx11_(&local_268,this_00);
    this_01 = tcu::MessageBuilder::operator<<(&local_248,&local_268);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_268);
    tcu::MessageBuilder::~MessageBuilder(&local_248);
    pTVar18 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&attribSpec.useDefaultAttribute,pTVar18,
               (BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&attribSpec.useDefaultAttribute,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&attribSpec.useDefaultAttribute);
    AttributePack::clearArrays(this->m_glArrayPack);
    AttributePack::clearArrays(this->m_rrArrayPack);
    for (attribSpec.instanceDivisor = 0; iVar12 = attribSpec.instanceDivisor,
        sVar17 = std::
                 vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ::size(&this_00->attribs), iVar12 < (int)sVar17;
        attribSpec.instanceDivisor = attribSpec.instanceDivisor + 1) {
      __src = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::operator[](&this_00->attribs,(long)attribSpec.instanceDivisor);
      memcpy(&seed,__src,0x28);
      local_7c5 = 1;
      if (attribSpec.instanceDivisor != 0) {
        local_7c5 = attribSpec._29_1_;
      }
      attribValue.v.uData[3]._3_1_ = local_7c5 & 1;
      if ((attribSpec.normalize & 1U) == 0) {
        iVar12 = DrawTestSpec::AttributeSpec::hash((AttributeSpec *)&seed);
        iVar15 = DrawTestSpec::hash(this_00);
        SVar8 = attribSpec.storage;
        elementSize._0_4_ = iVar12 + iVar15 * 100 + attribSpec.instanceDivisor;
        iVar12 = DrawTestSpec::inputTypeSize(seed);
        local_808 = (long)(int)(SVar8 * iVar12);
        if (attribSpec.componentCount != 0) {
          local_808 = (long)attribSpec.componentCount;
        }
        local_810 = uVar21;
        if ((((uint6)MVar16 & 0x100) != 0) && (0 < attribSpec.stride)) {
          local_810 = (long)(this_00->instanceCount / attribSpec.stride + 1);
        }
        if (((uint6)MVar16 & 0x10000) == 0) {
          local_820 = local_810;
        }
        else {
          local_820 = de::max<unsigned_long>(local_810,(long)(this_00->indexMax + 1));
        }
        sVar20 = (long)(int)attribSpec.usage + local_808 * (local_820 - 1) +
                 (long)(int)(SVar8 * iVar12);
        bufferSize._0_4_ = (int)local_820;
        evaluatedElementCount._0_4_ = (int)local_808;
        pcVar23 = anon_unknown_1::RandomArrayGenerator::generateArray
                            ((int)elementSize,(int)bufferSize,attribSpec.storage,attribSpec.usage,
                             (int)evaluatedElementCount,seed);
        AttributePack::newArray(this->m_glArrayPack,attribSpec.inputType);
        AttributePack::newArray(this->m_rrArrayPack,attribSpec.inputType);
        pAVar22 = AttributePack::getArray(this->m_glArrayPack,attribSpec.instanceDivisor);
        anon_unknown_1::AttributeArray::data
                  (pAVar22,TARGET_ARRAY,sVar20,pcVar23,attribSpec.outputType);
        pAVar22 = AttributePack::getArray(this->m_rrArrayPack,attribSpec.instanceDivisor);
        anon_unknown_1::AttributeArray::data
                  (pAVar22,TARGET_ARRAY,sVar20,pcVar23,attribSpec.outputType);
        pAVar22 = AttributePack::getArray(this->m_glArrayPack,attribSpec.instanceDivisor);
        anon_unknown_1::AttributeArray::setupArray
                  (pAVar22,true,attribSpec.usage,attribSpec.storage,seed,OStack_410,
                   (bool)((byte)attribSpec.offset & 1),attribSpec.componentCount,attribSpec.stride,
                   (GenericVec4 *)local_c8,(bool)(attribValue.v.uData[3]._3_1_ & 1),
                   (bool)(attribSpec._30_1_ & 1));
        pAVar22 = AttributePack::getArray(this->m_rrArrayPack,attribSpec.instanceDivisor);
        anon_unknown_1::AttributeArray::setupArray
                  (pAVar22,true,attribSpec.usage,attribSpec.storage,seed,OStack_410,
                   (bool)((byte)attribSpec.offset & 1),attribSpec.componentCount,attribSpec.stride,
                   (GenericVec4 *)local_c8,(bool)(attribValue.v.uData[3]._3_1_ & 1),
                   (bool)(attribSpec._30_1_ & 1));
        if (pcVar23 != (char *)0x0) {
          operator_delete__(pcVar23);
        }
      }
      else {
        iVar12 = DrawTestSpec::AttributeSpec::hash((AttributeSpec *)&seed);
        iVar15 = DrawTestSpec::hash(this_00);
        attribValue.v.uData[2] = iVar12 * 10 + iVar15 * 100 + attribSpec.instanceDivisor;
        GVar25 = anon_unknown_1::RandomArrayGenerator::generateAttributeValue
                           (attribValue.v.iData[2],seed);
        attribValue.v._0_8_ = GVar25.v._8_8_;
        register0x00000000 = GVar25.v._0_8_;
        AttributePack::newArray(this->m_glArrayPack,STORAGE_USER);
        AttributePack::newArray(this->m_rrArrayPack,STORAGE_USER);
        pAVar22 = AttributePack::getArray(this->m_glArrayPack,attribSpec.instanceDivisor);
        anon_unknown_1::AttributeArray::setupArray
                  (pAVar22,false,0,attribSpec.storage,seed,OStack_410,false,0,0,
                   (GenericVec4 *)((long)&elementSize + 4),(bool)(attribValue.v.uData[3]._3_1_ & 1),
                   false);
        pAVar22 = AttributePack::getArray(this->m_rrArrayPack,attribSpec.instanceDivisor);
        anon_unknown_1::AttributeArray::setupArray
                  (pAVar22,false,0,attribSpec.storage,seed,OStack_410,false,0,0,
                   (GenericVec4 *)((long)&elementSize + 4),(bool)(attribValue.v.uData[3]._3_1_ & 1),
                   false);
      }
    }
    if ((local_721 & 1) != 0) {
      AttributePack::updateProgram(this->m_glArrayPack);
      AttributePack::updateProgram(this->m_rrArrayPack);
    }
    if (((uint6)MVar16 & 1) == 0) {
      AttributePack::render
                (this->m_glArrayPack,this_00->primitive,this_00->drawMethod,this_00->first,iVar13,
                 INDEXTYPE_LAST,(void *)0x0,0,0,this_00->instanceCount,this_00->indirectOffset,0,
                 nullAttribValue.v.fData[3],nullAttribValue.v.fData[2],(AttributeArray *)0x0);
      AttributePack::render
                (this->m_rrArrayPack,this_00->primitive,this_00->drawMethod,this_00->first,iVar13,
                 INDEXTYPE_LAST,(void *)0x0,0,0,this_00->instanceCount,this_00->indirectOffset,0,
                 nullAttribValue.v.fData[3],nullAttribValue.v.fData[2],(AttributeArray *)0x0);
    }
    else {
      iVar12 = DrawTestSpec::hash(this_00);
      iVar15 = DrawTestSpec::indexTypeSize(this_00->indexType);
      sVar20 = (long)this_00->indexPointerOffset + (long)iVar15 * uVar21;
      indexMax = (int)uVar21;
      pcVar23 = anon_unknown_1::RandomArrayGenerator::generateIndices
                          (iVar12,indexMax,this_00->indexType,this_00->indexPointerOffset,local_784,
                           iVar14,local_790);
      local_870 = pcVar23;
      if (this_00->indexStorage != STORAGE_USER) {
        local_870 = (char *)0x0;
      }
      glArray.
      super_UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      .m_data._8_8_ = local_870 + this_00->indexPointerOffset;
      pAVar22 = (AttributeArray *)operator_new(0x58);
      anon_unknown_1::AttributeArray::AttributeArray
                (pAVar22,this_00->indexStorage,this->m_glesContext);
      de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>::DefaultDeleter
                ((DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray> *)
                 &rrArray.
                  super_UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                  .m_data.field_0xf);
      de::details::
      UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::UniquePtr((UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                   *)local_4a0,pAVar22);
      pAVar22 = (AttributeArray *)operator_new(0x58);
      anon_unknown_1::AttributeArray::AttributeArray
                (pAVar22,this_00->indexStorage,&this->m_refContext->super_Context);
      de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>::DefaultDeleter
                ((DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray> *)
                 ((long)&err + 7));
      de::details::
      UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::UniquePtr((UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                   *)local_4b8);
      pAVar22 = de::details::
                UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                ::operator->((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                              *)local_4a0);
      anon_unknown_1::AttributeArray::data
                (pAVar22,TARGET_ELEMENT_ARRAY,sVar20,pcVar23,USAGE_STATIC_DRAW);
      pAVar22 = de::details::
                UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                ::operator->((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                              *)local_4b8);
      anon_unknown_1::AttributeArray::data
                (pAVar22,TARGET_ELEMENT_ARRAY,sVar20,pcVar23,USAGE_STATIC_DRAW);
      uVar10 = nullAttribValue.v.uData[3];
      uVar9 = nullAttribValue.v.uData[2];
      uVar7 = glArray.
              super_UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
              .m_data._8_8_;
      pAVar6 = this->m_glArrayPack;
      PVar1 = this_00->primitive;
      DVar2 = this_00->drawMethod;
      IVar3 = this_00->indexType;
      iVar14 = this_00->indexMin;
      iVar12 = this_00->indexMax;
      iVar15 = this_00->instanceCount;
      iVar4 = this_00->indirectOffset;
      iVar5 = this_00->baseVertex;
      pAVar22 = de::details::
                UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                ::get((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                       *)local_4a0);
      AttributePack::render
                (pAVar6,PVar1,DVar2,0,iVar13,IVar3,(void *)uVar7,iVar14,iVar12,iVar15,iVar4,iVar5,
                 (float)uVar10,(float)uVar9,pAVar22);
      uVar10 = nullAttribValue.v.uData[3];
      uVar9 = nullAttribValue.v.uData[2];
      uVar7 = glArray.
              super_UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
              .m_data._8_8_;
      pAVar6 = this->m_rrArrayPack;
      PVar1 = this_00->primitive;
      DVar2 = this_00->drawMethod;
      IVar3 = this_00->indexType;
      iVar14 = this_00->indexMin;
      iVar12 = this_00->indexMax;
      iVar15 = this_00->instanceCount;
      iVar4 = this_00->indirectOffset;
      iVar5 = this_00->baseVertex;
      pAVar22 = de::details::
                UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                ::get((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                       *)local_4b8);
      AttributePack::render
                (pAVar6,PVar1,DVar2,0,iVar13,IVar3,(void *)uVar7,iVar14,iVar12,iVar15,iVar4,iVar5,
                 (float)uVar10,(float)uVar9,pAVar22);
      if (pcVar23 != (char *)0x0) {
        operator_delete__(pcVar23);
      }
      de::details::
      UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::~UniquePtr((UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                    *)local_4b8);
      de::details::
      UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::~UniquePtr((UniquePtr<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                    *)local_4a0);
    }
  }
  else {
    if (iVar13 % 2 != 1) {
      this_local._4_4_ = STOP;
      goto LAB_00f8d2a1;
    }
    bVar24 = compare(this,this_00->primitive);
    if (!bVar24) {
      local_6a8 = DrawTestSpec::isCompatibilityTest(this_00);
      if (local_6a8 == COMPATIBILITY_UNALIGNED_OFFSET) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c8,"Failed to draw with unaligned buffers.",&local_6c9);
        tcu::ResultCollector::addResult
                  (&this->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,&local_6c8);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::allocator<char>::~allocator(&local_6c9);
      }
      else if (local_6a8 == COMPATIBILITY_UNALIGNED_STRIDE) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f0,"Failed to draw with unaligned stride.",&local_6f1);
        tcu::ResultCollector::addResult
                  (&this->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,&local_6f0);
        std::__cxx11::string::~string((string *)&local_6f0);
        std::allocator<char>::~allocator(&local_6f1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"Image comparison failed.",&local_719);
        tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_FAIL,&local_718);
        std::__cxx11::string::~string((string *)&local_718);
        std::allocator<char>::~allocator(&local_719);
      }
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&this->m_result,(this->super_TestCase).super_TestNode.m_testCtx);
  this->m_iteration = this->m_iteration + 1;
LAB_00f8d2a1:
  anon_unknown_1::IterationLogSectionEmitter::~IterationLogSectionEmitter
            ((IterationLogSectionEmitter *)local_68);
  return this_local._4_4_;
}

Assistant:

DrawTest::IterateResult DrawTest::iterate (void)
{
	const int					specNdx			= (m_iteration / 2);
	const bool					drawStep		= (m_iteration % 2) == 0;
	const bool					compareStep		= (m_iteration % 2) == 1;
	const IterateResult			iterateResult	= ((size_t)m_iteration + 1 == m_specs.size()*2) ? (STOP) : (CONTINUE);
	const DrawTestSpec&			spec			= m_specs[specNdx];
	const bool					updateProgram	= (m_iteration == 0) || (drawStep && !checkSpecsShaderCompatible(m_specs[specNdx], m_specs[specNdx-1])); // try to use the same shader in all iterations
	IterationLogSectionEmitter	sectionEmitter	(m_testCtx.getLog(), specNdx, m_specs.size(), m_iteration_descriptions[specNdx], drawStep && m_specs.size()!=1);

	if (drawStep)
	{
		const MethodInfo	methodInfo				= getMethodInfo(spec.drawMethod);
		const bool			indexed					= methodInfo.indexed;
		const bool			instanced				= methodInfo.instanced;
		const bool			ranged					= methodInfo.ranged;
		const bool			hasFirst				= methodInfo.first;
		const bool			hasBaseVtx				= methodInfo.baseVertex;

		const size_t		primitiveElementCount	= getElementCount(spec.primitive, spec.primitiveCount);						// !< elements to be drawn
		const int			indexMin				= (ranged) ? (spec.indexMin) : (0);
		const int			firstAddition			= (hasFirst) ? (spec.first) : (0);
		const int			baseVertexAddition		= (hasBaseVtx && spec.baseVertex > 0) ? ( spec.baseVertex) : (0);			// spec.baseVertex > 0 => Create bigger attribute buffer
		const int			indexBase				= (hasBaseVtx && spec.baseVertex < 0) ? (-spec.baseVertex) : (0);			// spec.baseVertex < 0 => Create bigger indices
		const size_t		elementCount			= primitiveElementCount + indexMin + firstAddition + baseVertexAddition;	// !< elements in buffer (buffer should have at least primitiveElementCount ACCESSIBLE (index range, first) elements)
		const int			maxElementIndex			= (int)primitiveElementCount + indexMin + firstAddition - 1;
		const int			indexMax				= de::max(0, (ranged) ? (de::clamp<int>(spec.indexMax, 0, maxElementIndex)) : (maxElementIndex));
		float				coordScale				= getCoordScale(spec);
		float				colorScale				= getColorScale(spec);

		rr::GenericVec4		nullAttribValue;

		// Log info
		m_testCtx.getLog() << TestLog::Message << spec.getMultilineDesc() << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << TestLog::EndMessage; // extra line for clarity

		// Data

		m_glArrayPack->clearArrays();
		m_rrArrayPack->clearArrays();

		for (int attribNdx = 0; attribNdx < (int)spec.attribs.size(); attribNdx++)
		{
			DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[attribNdx];
			const bool					isPositionAttr	= (attribNdx == 0) || (attribSpec.additionalPositionAttribute);

			if (attribSpec.useDefaultAttribute)
			{
				const int		seed		= 10 * attribSpec.hash() + 100 * spec.hash() + attribNdx;
				rr::GenericVec4 attribValue = RandomArrayGenerator::generateAttributeValue(seed, attribSpec.inputType);

				m_glArrayPack->newArray(DrawTestSpec::STORAGE_USER);
				m_rrArrayPack->newArray(DrawTestSpec::STORAGE_USER);

				m_glArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
				m_rrArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
			}
			else
			{
				const int					seed					= attribSpec.hash() + 100 * spec.hash() + attribNdx;
				const size_t				elementSize				= attribSpec.componentCount * DrawTestSpec::inputTypeSize(attribSpec.inputType);
				const size_t				stride					= (attribSpec.stride == 0) ? (elementSize) : (attribSpec.stride);
				const size_t				evaluatedElementCount	= (instanced && attribSpec.instanceDivisor > 0) ? (spec.instanceCount / attribSpec.instanceDivisor + 1) : (elementCount);
				const size_t				referencedElementCount	= (ranged) ? (de::max<size_t>(evaluatedElementCount, spec.indexMax + 1)) : (evaluatedElementCount);
				const size_t				bufferSize				= attribSpec.offset + stride * (referencedElementCount - 1) + elementSize;
				const char*					data					= RandomArrayGenerator::generateArray(seed, (int)referencedElementCount, attribSpec.componentCount, attribSpec.offset, (int)stride, attribSpec.inputType);

				try
				{
					m_glArrayPack->newArray(attribSpec.storage);
					m_rrArrayPack->newArray(attribSpec.storage);

					m_glArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);
					m_rrArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);

					m_glArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);
					m_rrArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);

					delete [] data;
					data = NULL;
				}
				catch (...)
				{
					delete [] data;
					throw;
				}
			}
		}

		// Shader program
		if (updateProgram)
		{
			m_glArrayPack->updateProgram();
			m_rrArrayPack->updateProgram();
		}

		// Draw
		try
		{
			// indices
			if (indexed)
			{
				const int		seed				= spec.hash();
				const size_t	indexElementSize	= DrawTestSpec::indexTypeSize(spec.indexType);
				const size_t	indexArraySize		= spec.indexPointerOffset + indexElementSize * elementCount;
				const char*		indexArray			= RandomArrayGenerator::generateIndices(seed, (int)elementCount, spec.indexType, spec.indexPointerOffset, indexMin, indexMax, indexBase);
				const char*		indexPointerBase	= (spec.indexStorage == DrawTestSpec::STORAGE_USER) ? (indexArray) : ((char*)DE_NULL);
				const char*		indexPointer		= indexPointerBase + spec.indexPointerOffset;

				de::UniquePtr<AttributeArray> glArray	(new AttributeArray(spec.indexStorage, *m_glesContext));
				de::UniquePtr<AttributeArray> rrArray	(new AttributeArray(spec.indexStorage, *m_refContext));

				try
				{
					glArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);
					rrArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);

					m_glArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, glArray.get());
					m_rrArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, rrArray.get());

					delete [] indexArray;
					indexArray = NULL;
				}
				catch (...)
				{
					delete [] indexArray;
					throw;
				}
			}
			else
			{
				m_glArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
				m_rrArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
			}
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;
		}
	}
	else if (compareStep)
	{
		if (!compare(spec.primitive))
		{
			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_result.addResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}

	m_result.setTestContextResult(m_testCtx);

	m_iteration++;
	return iterateResult;
}